

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O3

void __thiscall
chrono::ChForce::GetBodyForceTorque
          (ChForce *this,ChVector<double> *body_force,ChVector<double> *body_torque)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (this->mode == TORQUE) {
    if (body_force != (ChVector<double> *)&VNULL) {
      body_force->m_data[0] = VNULL;
      body_force->m_data[1] = DAT_00b689a0;
      body_force->m_data[2] = DAT_00b689a8;
    }
    if (&this->relforce == body_torque) {
      return;
    }
    body_torque->m_data[0] = (this->relforce).m_data[0];
    body_torque->m_data[1] = (this->relforce).m_data[1];
    dVar3 = (this->relforce).m_data[2];
  }
  else {
    if (this->mode != FORCE) {
      return;
    }
    if (&this->force != body_force) {
      body_force->m_data[0] = (this->force).m_data[0];
      body_force->m_data[1] = (this->force).m_data[1];
      body_force->m_data[2] = (this->force).m_data[2];
    }
    dVar3 = (this->relforce).m_data[1];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this->relforce).m_data[0];
    dVar1 = (this->vrelpoint).m_data[2];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    dVar2 = (this->vrelpoint).m_data[0];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->relforce).m_data[2];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->vrelpoint).m_data[1];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar3 * 0.0;
    auVar10 = vfnmadd231sd_fma(auVar11,auVar10,auVar9);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar3 * dVar2;
    auVar4 = vfmsub231sd_fma(auVar4,auVar8,auVar9);
    auVar10 = vfmadd231sd_fma(auVar10,auVar5,auVar6);
    auVar4 = vfmadd231sd_fma(auVar4,auVar5,ZEXT816(0) << 0x40);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1 * dVar3;
    auVar6 = vfmadd231sd_fma(auVar7,auVar9,ZEXT816(0) << 0x40);
    dVar3 = -auVar4._0_8_;
    auVar4 = vfnmadd231sd_fma(auVar6,auVar8,auVar5);
    auVar10 = vunpcklpd_avx(auVar4,auVar10);
    body_torque->m_data[0] = -auVar10._0_8_;
    body_torque->m_data[1] = -auVar10._8_8_;
  }
  body_torque->m_data[2] = dVar3;
  return;
}

Assistant:

void ChForce::GetBodyForceTorque(ChVector<>& body_force, ChVector<>& body_torque) const {
    switch (mode) {
        case FORCE: {
            body_force = force;  // Fb = F.w
            ChStarMatrix33<> Xpos(vrelpoint);
            body_torque = -(Xpos.transpose() * relforce);  // Mb = - [u]'[A]'F,w   = - [u]'F,l
            break;
        }
        case TORQUE:
            body_force = VNULL;      // Fb = 0;
            body_torque = relforce;  // Mb = [A]'F,w   = F,l
            break;

        default:
            break;
    }
}